

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::PointLightSource::writeTo(PointLightSource *this,BinaryWriter *binary)

{
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->from);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->I);
  (*(this->Ispectrum).super_Entity._vptr_Entity[1])(&this->Ispectrum,binary);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->scale);
  return 0x49;
}

Assistant:

int PointLightSource::writeTo(BinaryWriter &binary) 
  {
    binary.write(from);
    binary.write(I);
    binary.write(Ispectrum);
    binary.write(scale);
    return TYPE_POINT_LIGHT_SOURCE;
  }